

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase145::run(TestCase145 *this)

{
  undefined8 node;
  __pid_t __pid;
  char *in_R8;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  *in_R9;
  DebugComparison<int,_int_&> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  siginfo_t info;
  UnixEventPort port;
  char *params_2;
  Promise<siginfo_t> *params_3;
  Promise<siginfo_t> *this_00;
  anon_enum_32 local_26c;
  undefined1 local_268 [40];
  EventLoop *local_240;
  undefined4 local_238;
  Maybe<kj::TimerImpl::SleepHooks_&> local_230;
  SignalPromiseAdapter *pSStack_228;
  char *local_220;
  char *pcStack_218;
  unsigned_long local_210;
  EventLoop local_208;
  Promise<siginfo_t> local_190;
  int local_188 [30];
  UnixEventPort local_110;
  
  if ((anonymous_namespace)::BROKEN_QEMU == '\0') {
    captureSignals();
    UnixEventPort::UnixEventPort(&local_110);
    EventLoop::EventLoop(&local_208,&local_110.super_EventPort);
    local_238 = 0xffffffff;
    local_230.ptr = (SleepHooks *)0x0;
    pSStack_228 = (SignalPromiseAdapter *)0x0;
    local_240 = &local_208;
    EventLoop::enterScope(&local_208);
    __pid = getpid();
    kill(__pid,0x17);
    UnixEventPort::onSignal((UnixEventPort *)local_268,(int)&local_110);
    local_220 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    pcStack_218 = "run";
    local_210 = 0x140000009b;
    params_2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    params_3 = (Promise<siginfo_t> *)0x4ac413;
    this_00 = &local_190;
    Promise<siginfo_t>::wait(this_00,local_268);
    node = local_268._0_8_;
    if ((PromiseArenaMember *)local_268._0_8_ != (PromiseArenaMember *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    local_268[0x20] = (int)local_190.super_PromiseBase.node.ptr == 0x17;
    local_268._0_4_ = _SC_AIO_LISTIO_MAX;
    local_268._16_8_ = " == ";
    local_268._24_8_ = &DAT_00000005;
    if ((!local_268[0x20]) && (kj::_::Debug::minSeverity < 3)) {
      params_2 = (char *)&local_26c;
      local_26c = _SC_AIO_LISTIO_MAX;
      in_R8 = "failed: expected (23) == (info.si_signo)";
      in_R9 = (DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
               *)local_268;
      local_268._8_8_ = this_00;
      kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x9c,ERROR,
                 "\"failed: expected \" \"(23) == (info.si_signo)\", _kjCondition, 23, info.si_signo"
                 ,(char (*) [41])"failed: expected (23) == (info.si_signo)",
                 (DebugComparison<int,_int_&> *)in_R9,(int *)params_2,(int *)this_00);
      params_3 = this_00;
    }
    local_268._8_8_ = local_188;
    local_268[0x20] = local_188[0] == 0;
    local_268._0_8_ = (ulong)(uint)local_268._4_4_ << 0x20;
    local_268._16_8_ = " == ";
    local_268._24_8_ = &DAT_00000005;
    if ((!local_268[0x20]) && (kj::_::Debug::minSeverity < 3)) {
      local_26c = DT_UNKNOWN;
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<__11,int&>&,__11,int&>
                ((char *)0x9d,(int)local_268,(LogSeverity)&local_26c,(char *)local_268._8_8_,
                 (char (*) [45])in_R8,in_R9,(anon_enum_32 *)params_2,(int *)params_3);
    }
    if (local_230.ptr == (SleepHooks *)0x0) {
      EventLoop::leaveScope(local_240);
    }
    EventLoop::~EventLoop(&local_208);
    UnixEventPort::~UnixEventPort(&local_110);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, Signals) {
  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}